

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Exe.cpp
# Opt level: O1

int amrex::parser_local_symbol_index
              (parser_symbol *sym,Vector<char_*,_std::allocator<char_*>_> *param_2)

{
  pointer ppcVar1;
  char *__s1;
  int iVar2;
  long lVar3;
  pointer ppcVar4;
  pointer ppcVar5;
  
  ppcVar1 = (param_2->super_vector<char_*,_std::allocator<char_*>_>).
            super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
            _M_start;
  ppcVar5 = (param_2->super_vector<char_*,_std::allocator<char_*>_>).
            super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  lVar3 = (long)ppcVar5 - (long)ppcVar1 >> 5;
  ppcVar4 = ppcVar5;
  if (0 < lVar3) {
    __s1 = sym->name;
    ppcVar4 = ppcVar5 + lVar3 * -4;
    ppcVar5 = ppcVar5 + -2;
    lVar3 = lVar3 + 1;
    do {
      iVar2 = strcmp(__s1,ppcVar5[1]);
      if (iVar2 == 0) {
        ppcVar5 = ppcVar5 + 2;
        goto LAB_00668de5;
      }
      iVar2 = strcmp(__s1,*ppcVar5);
      if (iVar2 == 0) {
        ppcVar5 = ppcVar5 + 1;
        goto LAB_00668de5;
      }
      iVar2 = strcmp(__s1,ppcVar5[-1]);
      if (iVar2 == 0) goto LAB_00668de5;
      iVar2 = strcmp(__s1,ppcVar5[-2]);
      if (iVar2 == 0) {
        ppcVar5 = ppcVar5 + -1;
        goto LAB_00668de5;
      }
      ppcVar5 = ppcVar5 + -4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)ppcVar4 - (long)ppcVar1 >> 3;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      ppcVar5 = ppcVar1;
      if ((lVar3 != 3) || (iVar2 = strcmp(sym->name,ppcVar4[-1]), ppcVar5 = ppcVar4, iVar2 == 0))
      goto LAB_00668de5;
      ppcVar4 = ppcVar4 + -1;
    }
    iVar2 = strcmp(sym->name,ppcVar4[-1]);
    ppcVar5 = ppcVar4;
    if (iVar2 == 0) goto LAB_00668de5;
    ppcVar4 = ppcVar4 + -1;
  }
  iVar2 = strcmp(sym->name,ppcVar4[-1]);
  ppcVar5 = ppcVar4;
  if (iVar2 != 0) {
    ppcVar5 = ppcVar1;
  }
LAB_00668de5:
  iVar2 = -1;
  if (ppcVar5 != ppcVar1) {
    iVar2 = (int)((ulong)((long)ppcVar5 - (long)ppcVar1) >> 3) + -1;
  }
  return iVar2;
}

Assistant:

static int parser_local_symbol_index (struct parser_symbol* sym, Vector<char*>& local_variables)
{
    auto r = std::find_if(local_variables.rbegin(), local_variables.rend(),
                          [=] (char* i) { return std::strcmp(sym->name, i) == 0; });
    if (r != local_variables.rend()) {
        return std::distance(r, local_variables.rend()) - 1;
    } else {
        return -1;
    }
}